

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_routines_hist.c
# Opt level: O3

int WebRtcIsac_DecHistOneStepMulti
              (int *data,Bitstr *streamdata,uint16_t **cdf,uint16_t *init_index,int N)

{
  uint8_t *puVar1;
  ushort *puVar2;
  ushort uVar3;
  ushort *puVar4;
  uint32_t uVar5;
  uint8_t *puVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint32_t uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint32_t uVar15;
  bool bVar16;
  
  uVar15 = streamdata->W_upper;
  if (uVar15 == 0) {
    return -2;
  }
  puVar6 = streamdata->stream + streamdata->stream_index;
  if (streamdata->stream_index == 0) {
    uVar12 = *(uint *)puVar6;
    puVar6 = puVar6 + 3;
    uVar10 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
  }
  else {
    uVar10 = streamdata->streamval;
  }
  if (0 < N) {
    do {
      uVar9 = uVar15 & 0xffff;
      uVar11 = uVar15 >> 0x10;
      puVar4 = *cdf;
      uVar3 = puVar4[*init_index];
      uVar12 = (uVar9 * uVar3 >> 0x10) + uVar11 * uVar3;
      uVar8 = (ulong)((uint)*init_index * 2);
      if (uVar12 < uVar10) {
        do {
          uVar14 = uVar12;
          if (uVar3 == 0xffff) {
            return -3;
          }
          uVar3 = *(ushort *)((long)puVar4 + uVar8 + 2);
          uVar13 = (uVar3 * uVar9 >> 0x10) + uVar11 * uVar3;
          uVar8 = uVar8 + 2;
          uVar12 = uVar13;
        } while (uVar13 < uVar10);
        iVar7 = (int)((long)uVar8 >> 1) + -1;
      }
      else {
        do {
          uVar13 = uVar12;
          puVar2 = (ushort *)((long)puVar4 + (uVar8 - 2));
          if (puVar2 < puVar4) {
            return -3;
          }
          uVar12 = (uint)*puVar2;
          uVar14 = (uVar12 * uVar9 >> 0x10) + uVar11 * uVar12;
          uVar8 = uVar8 - 2;
          uVar12 = uVar14;
        } while (uVar10 <= uVar14);
        iVar7 = (int)(uVar8 >> 1);
      }
      *data = iVar7;
      uVar15 = uVar13 - (uVar14 + 1);
      uVar10 = uVar10 - (uVar14 + 1);
      uVar12 = uVar15;
      if (uVar15 < 0x1000000) {
        do {
          puVar1 = puVar6 + 1;
          puVar6 = puVar6 + 1;
          uVar10 = uVar10 << 8 | (uint)*puVar1;
          uVar15 = uVar12 << 8;
          bVar16 = uVar12 < 0x10000;
          uVar12 = uVar15;
        } while (bVar16);
      }
      init_index = init_index + 1;
      data = data + 1;
      cdf = cdf + 1;
      bVar16 = 1 < N;
      N = N + -1;
    } while (bVar16);
  }
  uVar5 = (int)puVar6 - (int)streamdata;
  streamdata->stream_index = uVar5;
  streamdata->W_upper = uVar15;
  streamdata->streamval = uVar10;
  if (uVar15 < 0x2000000) {
    iVar7 = uVar5 - 1;
  }
  else {
    iVar7 = uVar5 - 2;
  }
  return iVar7;
}

Assistant:

int WebRtcIsac_DecHistOneStepMulti(int *data,        /* output: data vector */
                                   Bitstr *streamdata,      /* in-/output struct containing bitstream */
                                   const uint16_t **cdf,   /* input: array of cdf arrays */
                                   const uint16_t *init_index, /* input: vector of initial cdf table search entries */
                                   const int N)     /* input: data vector length */
{
  uint32_t    W_lower, W_upper;
  uint32_t    W_tmp;
  uint32_t    W_upper_LSB, W_upper_MSB;
  uint32_t    streamval;
  const   uint8_t *stream_ptr;
  const   uint16_t *cdf_ptr;
  int     k;


  stream_ptr = streamdata->stream + streamdata->stream_index;
  W_upper = streamdata->W_upper;
  if (W_upper == 0)
    /* Should not be possible in normal operation */
    return -2;

  if (streamdata->stream_index == 0)   /* first time decoder is called for this stream */
  {
    /* read first word from bytestream */
    streamval = *stream_ptr << 24;
    streamval |= *++stream_ptr << 16;
    streamval |= *++stream_ptr << 8;
    streamval |= *++stream_ptr;
  } else {
    streamval = streamdata->streamval;
  }


  for (k=N; k>0; k--)
  {
    /* find the integer *data for which streamval lies in [W_lower+1, W_upper] */
    W_upper_LSB = W_upper & 0x0000FFFF;
    W_upper_MSB = W_upper >> 16;

    /* start at the specified table entry */
    cdf_ptr = *cdf + (*init_index++);
    W_tmp = W_upper_MSB * *cdf_ptr;
    W_tmp += (W_upper_LSB * *cdf_ptr) >> 16;
    if (streamval > W_tmp)
    {
      for ( ;; )
      {
        W_lower = W_tmp;
        if (cdf_ptr[0]==65535)
          /* range check */
          return -3;
        W_tmp = W_upper_MSB * *++cdf_ptr;
        W_tmp += (W_upper_LSB * *cdf_ptr) >> 16;
        if (streamval <= W_tmp) break;
      }
      W_upper = W_tmp;
      *data++ = (int)(cdf_ptr - *cdf++ - 1);
    } else {
      for ( ;; )
      {
        W_upper = W_tmp;
        --cdf_ptr;
        if (cdf_ptr<*cdf) {
          /* range check */
          return -3;
        }
        W_tmp = W_upper_MSB * *cdf_ptr;
        W_tmp += (W_upper_LSB * *cdf_ptr) >> 16;
        if (streamval > W_tmp) break;
      }
      W_lower = W_tmp;
      *data++ = (int)(cdf_ptr - *cdf++);
    }

    /* shift interval to start at zero */
    W_upper -= ++W_lower;
    /* add integer to bitstream */
    streamval -= W_lower;

    /* renormalize interval and update streamval */
    while ( !(W_upper & 0xFF000000) )    /* W_upper < 2^24 */
    {
      /* read next byte from stream */
      streamval = (streamval << 8) | *++stream_ptr;
      W_upper <<= 8;
    }
  }

  streamdata->stream_index = (int)(stream_ptr - streamdata->stream);
  streamdata->W_upper = W_upper;
  streamdata->streamval = streamval;


  /* find number of bytes in original stream (determined by current interval width) */
  if ( W_upper > 0x01FFFFFF )
    return streamdata->stream_index - 2;
  else
    return streamdata->stream_index - 1;
}